

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O1

void __thiscall
pbrt::StratifiedSampler::StartPixelSample(StratifiedSampler *this,Point2i *p,int index,int dim)

{
  uint64_t uVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  uint64_t uVar8;
  ulong uVar9;
  
  lVar3 = 0x5851f42d4c957f2d;
  (this->pixel).super_Tuple2<pbrt::Point2,_int> = p->super_Tuple2<pbrt::Point2,_int>;
  this->sampleIndex = index;
  this->dimension = dim;
  uVar9 = (ulong)(uint)this->seed << 0x20 |
          (long)(p->super_Tuple2<pbrt::Point2,_int>).y * 0x10000 +
          (long)(p->super_Tuple2<pbrt::Point2,_int>).x;
  uVar7 = (uVar9 >> 0x1f ^ uVar9) * 0x7fb5d329728ea185;
  uVar7 = (uVar7 >> 0x1b ^ uVar7) * -0x7e25210b43d22bb3;
  uVar8 = uVar9 * 2 + 1;
  (this->rng).inc = uVar8;
  uVar1 = ((uVar7 >> 0x21 ^ uVar7) + 1) * 0x5851f42d4c957f2d + uVar9 * -0x4f5c17a566d501a4 + 1;
  (this->rng).state = uVar1;
  iVar5 = index * 0x10000 + dim;
  if (iVar5 == 0) {
    lVar6 = 0;
    lVar4 = 1;
  }
  else {
    lVar4 = 1;
    lVar6 = 0;
    uVar7 = (long)iVar5;
    do {
      if ((uVar7 & 1) != 0) {
        lVar4 = lVar4 * lVar3;
        lVar6 = lVar6 * lVar3 + uVar8;
      }
      uVar8 = uVar8 * (lVar3 + 1);
      lVar3 = lVar3 * lVar3;
      bVar2 = 1 < uVar7;
      uVar7 = uVar7 >> 1;
    } while (bVar2);
  }
  (this->rng).state = lVar4 * uVar1 + lVar6;
  return;
}

Assistant:

PBRT_CPU_GPU
    void StartPixelSample(const Point2i &p, int index, int dim) {
        pixel = p;
        sampleIndex = index;
        dimension = dim;
        rng.SetSequence((p.x + p.y * 65536) | (uint64_t(seed) << 32));
        rng.Advance(sampleIndex * 65536 + dimension);
    }